

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O1

bool __thiscall
Refal2::CVariables::Get(CVariables *this,TVariableIndex variableIndex,TTableIndex *tableIndex)

{
  int iVar1;
  int iVar2;
  TTableIndex *pTVar3;
  CVariable *pCVar4;
  int iVar5;
  
  if ((-1 < variableIndex) && (variableIndex < this->variablesSize)) {
    pTVar3 = this->variablesValues;
    if (pTVar3 != (TTableIndex *)0x0) {
      pCVar4 = this->variables;
      iVar1 = pCVar4[(uint)variableIndex].originPosition;
      iVar2 = pCVar4[(uint)variableIndex].position;
      iVar5 = iVar2;
      if (iVar1 < iVar2) {
        iVar5 = iVar2 + -1;
        pCVar4[(uint)variableIndex].position = iVar5;
      }
      *tableIndex = pTVar3[iVar5];
      return iVar1 < iVar2;
    }
    __assert_fail("variablesValues != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                  ,0x40,"bool Refal2::CVariables::Get(TVariableIndex, TTableIndex &)");
  }
  __assert_fail("IsValidVariableIndex( variableIndex )",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                ,0x3f,"bool Refal2::CVariables::Get(TVariableIndex, TTableIndex &)");
}

Assistant:

bool CVariables::Get( TVariableIndex variableIndex, TTableIndex& tableIndex)
{
	assert( IsValidVariableIndex( variableIndex ) );
	assert( variablesValues != 0 );
	CVariable& variable = variables[variableIndex];
	if( variable.position > variable.originPosition ) {
		variable.position--;
		tableIndex = variablesValues[variable.position];
		return true;
	} else /* var.position == var.originPosition */ {
		tableIndex = variablesValues[variable.position];
		return false;
	}
}